

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall
Session::setAsymmetricCryptoOp(Session *this,AsymmetricAlgorithm *inAsymmetricCryptoOp)

{
  CryptoFactory *pCVar1;
  AsymmetricAlgorithm *pAVar2;
  
  pAVar2 = this->asymmetricCryptoOp;
  if (pAVar2 == (AsymmetricAlgorithm *)0x0) goto LAB_0016fb2e;
  if (this->publicKey == (PublicKey *)0x0) {
LAB_0016fafc:
    if (this->privateKey != (PrivateKey *)0x0) {
      (*pAVar2->_vptr_AsymmetricAlgorithm[0x1b])();
    }
    this->privateKey = (PrivateKey *)0x0;
  }
  else {
    (*pAVar2->_vptr_AsymmetricAlgorithm[0x1a])();
    pAVar2 = this->asymmetricCryptoOp;
    this->publicKey = (PublicKey *)0x0;
    if (pAVar2 != (AsymmetricAlgorithm *)0x0) goto LAB_0016fafc;
  }
  pCVar1 = CryptoFactory::i();
  (*pCVar1->_vptr_CryptoFactory[3])(pCVar1,this->asymmetricCryptoOp);
LAB_0016fb2e:
  this->asymmetricCryptoOp = inAsymmetricCryptoOp;
  return;
}

Assistant:

void Session::setAsymmetricCryptoOp(AsymmetricAlgorithm *inAsymmetricCryptoOp)
{
	if (asymmetricCryptoOp != NULL)
	{
		setPublicKey(NULL);
		setPrivateKey(NULL);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(asymmetricCryptoOp);
	}

	asymmetricCryptoOp = inAsymmetricCryptoOp;
}